

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O0

void AddSingleSector(plane *scrollplane,sector_t_conflict *sector,int movetype)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  FLinkedSector *pFVar4;
  undefined1 local_30 [8];
  FLinkedSector newlink;
  uint i;
  int movetype_local;
  sector_t_conflict *sector_local;
  plane *scrollplane_local;
  
  newlink.Type = 0;
  newlink._12_4_ = movetype;
  while( true ) {
    iVar1 = newlink.Type;
    uVar3 = TArray<FLinkedSector,_FLinkedSector>::Size(&scrollplane->Sectors);
    if (uVar3 <= (uint)iVar1) {
      newlink.Sector._0_4_ = newlink._12_4_;
      local_30 = (undefined1  [8])sector;
      TArray<FLinkedSector,_FLinkedSector>::Push(&scrollplane->Sectors,(FLinkedSector *)local_30);
      return;
    }
    pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[]
                       (&scrollplane->Sectors,(ulong)(uint)newlink.Type);
    if (pFVar4->Sector == sector) break;
    newlink.Type = newlink.Type + 1;
  }
  if ((newlink._12_4_ & 5) != 0) {
    pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[]
                       (&scrollplane->Sectors,(ulong)(uint)newlink.Type);
    pFVar4->Type = pFVar4->Type & 0xfffffffa;
  }
  if ((newlink._12_4_ & 10) != 0) {
    pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[]
                       (&scrollplane->Sectors,(ulong)(uint)newlink.Type);
    pFVar4->Type = pFVar4->Type & 0xfffffff5;
  }
  uVar2 = newlink._12_4_;
  pFVar4 = TArray<FLinkedSector,_FLinkedSector>::operator[]
                     (&scrollplane->Sectors,(ulong)(uint)newlink.Type);
  pFVar4->Type = uVar2 | pFVar4->Type;
  return;
}

Assistant:

static void AddSingleSector(extsector_t::linked::plane &scrollplane, sector_t *sector, int movetype)
{
	// First we have to check the list if the sector is already in it
	// If so the move type must be adjusted

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Sector == sector)
		{
			if (movetype & LINK_FLOORBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_FLOORBITS;
			}

			if (movetype & LINK_CEILINGBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_CEILINGBITS;
			}

			scrollplane.Sectors[i].Type |= movetype;
			return;
		}
	}

	// The sector hasn't been attached yet so do it now

	FLinkedSector newlink = {sector, movetype};
	scrollplane.Sectors.Push(newlink);
}